

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcSymLocal * __thiscall
CTcPrsSymtab::add_local
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int param_3,int copy_str,int init_assigned,
          int init_referenced)

{
  ushort *puVar1;
  byte *pbVar2;
  CVmHashEntry *pCVar3;
  CTcTokenizer *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  CVmHashEntry *this_00;
  CVmHashEntry *pCVar6;
  
  iVar5 = (*this->_vptr_CTcPrsSymtab[2])();
  if (CONCAT44(extraout_var,iVar5) == 0) {
    this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x68);
    CVmHashEntry::CVmHashEntry(this_00,sym,len,copy_str);
    *(undefined4 *)&this_00->field_0x24 = 4;
    this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00351e28;
    *(int *)&this_00[1].str_ = param_3;
    *(undefined4 *)((long)&this_00[1].str_ + 4) = 0;
    this_00[1].len_ = 0;
    this_00[2]._vptr_CVmHashEntry = (_func_int **)0x0;
    this_00[2].nxt_ = (CVmHashEntry *)0x0;
    puVar1 = (ushort *)((long)&this_00[2].str_ + 4);
    *puVar1 = *puVar1 & 0xfe00;
    pCVar4 = G_tok;
    this_00[1]._vptr_CVmHashEntry = (_func_int **)G_tok->last_desc_;
    this_00[1].nxt_ = (CVmHashEntry *)pCVar4->last_linenum_;
    this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0035bbd0;
    pCVar6 = this_00;
    if (init_assigned != 0) {
      do {
        pbVar2 = (byte *)((long)&pCVar6[2].str_ + 4);
        *pbVar2 = *pbVar2 | 0x80;
        pCVar3 = pCVar6 + 2;
        pCVar6 = (CVmHashEntry *)pCVar3->_vptr_CVmHashEntry;
      } while ((CVmHashEntry *)pCVar3->_vptr_CVmHashEntry != (CVmHashEntry *)0x0);
    }
    pCVar6 = this_00;
    if (init_referenced != 0) {
      do {
        pbVar2 = (byte *)((long)&pCVar6[2].str_ + 4);
        *pbVar2 = *pbVar2 | 0x40;
        pCVar3 = pCVar6 + 2;
        pCVar6 = (CVmHashEntry *)pCVar3->_vptr_CVmHashEntry;
      } while ((CVmHashEntry *)pCVar3->_vptr_CVmHashEntry != (CVmHashEntry *)0x0);
    }
    (*this->_vptr_CTcPrsSymtab[3])(this,this_00);
  }
  else {
    this_00 = (CVmHashEntry *)0x0;
    CTcTokenizer::log_error(0x2b37,len & 0xffffffff,sym);
  }
  return (CTcSymLocal *)this_00;
}

Assistant:

CTcSymLocal *CTcPrsSymtab::add_local(const textchar_t *sym, size_t len,
                                     int local_num, int copy_str,
                                     int init_assigned, int init_referenced)
{
    CTcSymLocal *lcl;

    /* 
     *   make sure the symbol isn't already defined in this scope; if it
     *   is, log an error 
     */
    if (find_direct(sym, len) != 0)
    {
        /* log the error */
        G_tok->log_error(TCERR_LOCAL_REDEF, (int)len, sym);

        /* don't create the symbol again - return the original definition */
        return 0;
    }

    /* create the symbol entry */
    lcl = new CTcSymLocal(sym, len, copy_str, FALSE, local_num);

    /* 
     *   if the symbol is initially to be marked as referenced or
     *   assigned, mark it now 
     */
    if (init_assigned)
        lcl->set_val_assigned(TRUE);
    if (init_referenced)
        lcl->set_val_used(TRUE);
    
    /* add it to the table */
    add_entry(lcl);

    /* return the new local */
    return lcl;
}